

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O3

HFParsingInfo * __thiscall
MlmWrap::createDigitalParsingInfo
          (HFParsingInfo *__return_storage_ptr__,MlmWrap *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *channels,string *dataformat)

{
  pointer pcVar1;
  pointer pbVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  bool bVar4;
  int bit;
  ostream *poVar5;
  int iVar6;
  MlmWrap *pMVar7;
  ulong uVar8;
  _Alloc_hider _Var9;
  pointer pbVar10;
  string ch;
  string dv;
  vector<int,_std::allocator<int>_> startlengths;
  HFParsingInfo info;
  NDeviceChannel channel;
  undefined1 local_258 [32];
  string local_238;
  vector<int,_std::allocator<int>_> local_218;
  undefined1 local_200 [72];
  vector<int,_std::allocator<int>_> local_1b8;
  ulong local_1a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  int local_180;
  string local_178;
  string local_158;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_138;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  undefined1 local_90 [32];
  
  local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pcVar1 = (dataformat->_M_dataplus)._M_p;
  pMVar7 = (MlmWrap *)local_90;
  local_90._0_8_ = local_90 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)pMVar7,pcVar1,pcVar1 + dataformat->_M_string_length);
  bVar4 = verifyTrodesDataFormat(pMVar7,&local_218,(string *)local_90);
  if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
    operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
  }
  if (bVar4) {
    local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_198.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_198.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_198.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_200._0_4_ = 0;
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_1b8,(iterator)0x0,(int *)local_200);
    if ((long)local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != 0) {
      iVar6 = local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish[-1];
      uVar8 = 0;
      do {
        iVar6 = iVar6 + local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar8 + 1];
        local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish[-1] = iVar6;
        uVar8 = uVar8 + 2;
      } while (uVar8 < (ulong)((long)local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_finish -
                               (long)local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start >> 2));
    }
    pbVar10 = (channels->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (channels->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    local_138 = channels;
    if (pbVar10 != pbVar2) {
      do {
        std::__cxx11::string::find((char *)pbVar10,0x2830ae,0);
        std::__cxx11::string::substr((ulong)&local_d0,(ulong)pbVar10);
        CZHelp::trim_copy(&local_238,&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::find((char *)pbVar10,0x2830ae,0);
        std::__cxx11::string::substr((ulong)&local_f0,(ulong)pbVar10);
        CZHelp::trim_copy((string *)local_258,&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_158,local_238._M_dataplus._M_p,
                   local_238._M_dataplus._M_p + local_238._M_string_length);
        findTrodesDevice((NDevice *)local_200,this,&local_158);
        local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        pMVar7 = (MlmWrap *)local_258._0_8_;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_178,local_258._0_8_,(pointer)(local_258._0_8_ + local_258._8_8_)
                  );
        findTrodesChannel((NDeviceChannel *)&stack0xffffffffffffff90,pMVar7,(NDevice *)local_200,
                          &local_178);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
        }
        NDevice::~NDevice((NDevice *)local_200);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        bVar4 = NDeviceChannel::isValid((NDeviceChannel *)&stack0xffffffffffffff90);
        if (!bVar4) {
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"Could not find ","")
          ;
          error((string *)local_200,this,&local_110);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,
                              (char *)CONCAT44(local_200._4_4_,local_200._0_4_),local_200._8_8_);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,local_238._M_dataplus._M_p,local_238._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,(char *)local_258._0_8_,local_258._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,", aborting\n",0xb);
          if ((undefined1 *)CONCAT44(local_200._4_4_,local_200._0_4_) != local_200 + 0x10) {
            operator_delete((undefined1 *)CONCAT44(local_200._4_4_,local_200._0_4_),
                            local_200._16_8_ + 1);
          }
          _Var9._M_p = local_110._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
LAB_001850cc:
            operator_delete(_Var9._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
LAB_001850d4:
          (__return_storage_ptr__->dataRequested).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          *(undefined8 *)&__return_storage_ptr__->dataLength = 0;
          (__return_storage_ptr__->dataRequested).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->dataRequested).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          __return_storage_ptr__->sizeOf = 0;
          (__return_storage_ptr__->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          NDeviceChannel::~NDeviceChannel((NDeviceChannel *)&stack0xffffffffffffff90);
          if ((MlmWrap *)local_258._0_8_ != (MlmWrap *)(local_258 + 0x10)) {
            operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
          goto LAB_00185137;
        }
        iVar6 = NDeviceChannel::getType((NDeviceChannel *)&stack0xffffffffffffff90);
        if (iVar6 != 0) {
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_130,local_258._0_8_,
                     (pointer)(local_258._0_8_ + local_258._8_8_));
          error((string *)local_200,this,&local_130);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,
                              (char *)CONCAT44(local_200._4_4_,local_200._0_4_),local_200._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,
                     " is not an digital channel. Stopping and returning empty parsing info\n",0x46)
          ;
          if ((undefined1 *)CONCAT44(local_200._4_4_,local_200._0_4_) != local_200 + 0x10) {
            operator_delete((undefined1 *)CONCAT44(local_200._4_4_,local_200._0_4_),
                            local_200._16_8_ + 1);
          }
          local_110.field_2._M_allocated_capacity = local_130.field_2._M_allocated_capacity;
          _Var9._M_p = local_130._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) goto LAB_001850cc;
          goto LAB_001850d4;
        }
        iVar6 = NDeviceChannel::getStartByte((NDeviceChannel *)&stack0xffffffffffffff90);
        pMVar7 = (MlmWrap *)&stack0xffffffffffffff90;
        bit = NDeviceChannel::getStartBit((NDeviceChannel *)&stack0xffffffffffffff90);
        calculateDeviceChannelInfoIndices(pMVar7,&local_1b8,&local_218,iVar6,bit);
        NDeviceChannel::~NDeviceChannel((NDeviceChannel *)&stack0xffffffffffffff90);
        if ((MlmWrap *)local_258._0_8_ != (MlmWrap *)(local_258 + 0x10)) {
          operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        pbVar10 = pbVar10 + 1;
      } while (pbVar10 != pbVar2);
    }
    pvVar3 = local_138;
    local_1a0 = (long)local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2 & 0xfffffffffffffffe;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&local_198,local_138);
    local_180 = (int)((ulong)((long)(pvVar3->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pvVar3->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start) >> 5);
    (__return_storage_ptr__->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start;
    (__return_storage_ptr__->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    (__return_storage_ptr__->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    __return_storage_ptr__->sizeOf = local_1a0;
    (__return_storage_ptr__->dataRequested).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_198.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->dataRequested).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_198.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->dataRequested).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_198.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_198.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_198.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_198.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    __return_storage_ptr__->dataLength = local_180;
LAB_00185137:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_198);
    if (local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  else {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"Bad data format from Trodes, aborting\n","");
    error((string *)local_200,this,&local_b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,(char *)CONCAT44(local_200._4_4_,local_200._0_4_),
               local_200._8_8_);
    if ((undefined1 *)CONCAT44(local_200._4_4_,local_200._0_4_) != local_200 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_200._4_4_,local_200._0_4_),local_200._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    (__return_storage_ptr__->dataRequested).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    *(undefined8 *)&__return_storage_ptr__->dataLength = 0;
    (__return_storage_ptr__->dataRequested).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->dataRequested).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __return_storage_ptr__->sizeOf = 0;
    (__return_storage_ptr__->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  if (local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

HFParsingInfo MlmWrap::createDigitalParsingInfo(std::vector<std::string> channels, std::string dataformat){
    std::vector<int> startlengths;
    if(!verifyTrodesDataFormat(startlengths, dataformat)){
        std::cerr << error("Bad data format from Trodes, aborting\n");
        return HFParsingInfo();
    }

    HFParsingInfo info;
    //Calculate size of digital packet, first item in info.indices
    info.indices.push_back(0);
    for(size_t i = 0; i < startlengths.size(); i+=2){
        info.indices.back() += startlengths[i+1];
    }

    for(auto &channelstr : channels){
        std::string dv = CZHelp::trim_copy(channelstr.substr(0, channelstr.find(",")));
        std::string ch = CZHelp::trim_copy(channelstr.substr(channelstr.find(",")+1));

        //find channel
        NDeviceChannel channel = findTrodesChannel(findTrodesDevice(dv), ch);
        if(!channel.isValid()){
            std::cerr << error("Could not find ") << dv << ", " << ch << ", aborting\n";
            return HFParsingInfo();
        }

        //Checking for being digital
        if(channel.getType() != 0){
            std::cerr << error(ch) << " is not an digital channel. Stopping and returning empty parsing info\n";
            return HFParsingInfo();
        }

        //Push back digital indices, (startbyte, startbit)
        calculateDeviceChannelInfoIndices(info.indices, startlengths, channel.getStartByte(), channel.getStartBit());
    }
    info.sizeOf = (info.indices.size()/2)*sizeof(int16_t);
    info.dataRequested = channels;
    info.dataLength = channels.size();
    return info;
}